

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_uv_area_sign(REF_GRID ref_grid,REF_INT id,REF_DBL *sign)

{
  REF_GEOM ref_geom_00;
  REF_CELL ref_cell_00;
  REF_INT RVar1;
  uint uVar2;
  REF_STATUS RVar3;
  REF_DBL *pRVar4;
  int iVar5;
  int local_c8;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL uv_area;
  REF_INT nodes [27];
  int local_40;
  int local_3c;
  REF_INT cell;
  REF_INT face;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_DBL *sign_local;
  REF_INT id_local;
  REF_GRID ref_grid_local;
  
  ref_geom_00 = ref_grid->geom;
  if (ref_geom_00->uv_area_sign == (REF_DBL *)0x0) {
    ref_cell_00 = ref_grid->cell[3];
    if ((ref_geom_00->nface == -1) && (uVar2 = ref_geom_infer_nedge_nface(ref_grid), uVar2 != 0)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x117,
             "ref_geom_uv_area_sign",(ulong)uVar2,"infer counts");
      return uVar2;
    }
    if (ref_geom_00->nface < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x118,
             "ref_geom_uv_area_sign","malloc ref_geom->uv_area_sign of REF_DBL negative");
      return 1;
    }
    pRVar4 = (REF_DBL *)malloc((long)ref_geom_00->nface << 3);
    ref_geom_00->uv_area_sign = pRVar4;
    if (ref_geom_00->uv_area_sign == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x118,
             "ref_geom_uv_area_sign","malloc ref_geom->uv_area_sign of REF_DBL NULL");
      return 2;
    }
    for (local_c8 = 0; local_c8 < ref_geom_00->nface; local_c8 = local_c8 + 1) {
      ref_geom_00->uv_area_sign[local_c8] = 0.0;
    }
    for (local_40 = 0; local_40 < ref_cell_00->max; local_40 = local_40 + 1) {
      RVar3 = ref_cell_nodes(ref_cell_00,local_40,(REF_INT *)&uv_area);
      RVar1 = nodes[1];
      if (((RVar3 == 0) && (0 < nodes[1])) && (nodes[1] <= ref_geom_00->nface)) {
        uVar2 = ref_geom_uv_area(ref_geom_00,(REF_INT *)&uv_area,(REF_DBL *)&ref_malloc_init_i);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x11c,"ref_geom_uv_area_sign",(ulong)uVar2,"uv area");
          return uVar2;
        }
        if (0.0 <= _ref_malloc_init_i) {
          iVar5 = RVar1 + -1;
          ref_geom_00->uv_area_sign[iVar5] = ref_geom_00->uv_area_sign[iVar5] + 1.0;
        }
        else {
          iVar5 = RVar1 + -1;
          ref_geom_00->uv_area_sign[iVar5] = ref_geom_00->uv_area_sign[iVar5] - 1.0;
        }
      }
    }
    for (local_3c = 0; local_3c < ref_geom_00->nface; local_3c = local_3c + 1) {
      if (0.0 < ref_geom_00->uv_area_sign[local_3c] || ref_geom_00->uv_area_sign[local_3c] == 0.0) {
        ref_geom_00->uv_area_sign[local_3c] = 1.0;
      }
      else {
        ref_geom_00->uv_area_sign[local_3c] = -1.0;
      }
    }
  }
  if ((id < 1) || (ref_geom_00->nface < id)) {
    ref_grid_local._4_4_ = 3;
  }
  else {
    *sign = ref_geom_00->uv_area_sign[id + -1];
    ref_grid_local._4_4_ = 0;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_uv_area_sign(REF_GRID ref_grid, REF_INT id,
                                         REF_DBL *sign) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  if (NULL == ((ref_geom)->uv_area_sign)) {
    REF_CELL ref_cell = ref_grid_tri(ref_grid);
    REF_INT face;
    REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
    REF_DBL uv_area;
    if (REF_EMPTY == ref_geom->nface)
      RSS(ref_geom_infer_nedge_nface(ref_grid), "infer counts");
    ref_malloc_init(ref_geom->uv_area_sign, ref_geom->nface, REF_DBL, 0.0);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      face = nodes[3];
      if (face < 1 || ref_geom->nface < face) continue;
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
      if (uv_area < 0.0) {
        ((ref_geom)->uv_area_sign)[face - 1] -= 1.0;
      } else {
        ((ref_geom)->uv_area_sign)[face - 1] += 1.0;
      }
    }
    for (face = 0; face < ref_geom->nface; face++) {
      if (((ref_geom)->uv_area_sign)[face] < 0.0) {
        ((ref_geom)->uv_area_sign)[face] = -1.0;
      } else {
        ((ref_geom)->uv_area_sign)[face] = 1.0;
      }
    }
  }

  if (id < 1 || id > ref_geom->nface) return REF_INVALID;
  *sign = ((ref_geom)->uv_area_sign)[id - 1];

  return REF_SUCCESS;
}